

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O0

void __thiscall TasgridWrapper::setHierarchy(TasgridWrapper *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  vector<double,_std::allocator<double>_> local_380;
  uint local_364;
  string local_360;
  string local_340;
  allocator<char> local_319;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  string local_238;
  allocator<char> local_211;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150;
  string local_130;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_38 [8];
  Data2D<double> vals;
  TasgridWrapper *this_local;
  
  vals.vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  readMatrix((Data2D<double> *)local_38,this,&this->valsfilename);
  iVar2 = TasGrid::Data2D<double>::getNumStrips((Data2D<double> *)local_38);
  iVar3 = TasGrid::TasmanianSparseGrid::getNumPoints(&this->grid);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_108,"grid is awaiting ",&local_109);
  iVar4 = TasGrid::TasmanianSparseGrid::getNumPoints(&this->grid);
  std::__cxx11::to_string(&local_130,iVar4);
  std::operator+(&local_e8,&local_108,&local_130);
  std::operator+(&local_c8,&local_e8," hierarchical surpluses, but ");
  std::operator+(&local_a8,&local_c8,&this->valsfilename);
  std::operator+(&local_88,&local_a8," specifies ");
  iVar4 = TasGrid::Data2D<double>::getNumStrips((Data2D<double> *)local_38);
  std::__cxx11::to_string(&local_150,iVar4);
  std::operator+(&local_68,&local_88,&local_150);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  iassert(this,iVar2 == iVar3,pcVar5);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  bVar1 = TasGrid::TasmanianSparseGrid::isFourier(&this->grid);
  if (bVar1) {
    sVar6 = TasGrid::Data2D<double>::getStride((Data2D<double> *)local_38);
    iVar2 = TasGrid::TasmanianSparseGrid::getNumOutputs(&this->grid);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"fourier grid is set for ",&local_211);
    iVar3 = TasGrid::TasmanianSparseGrid::getNumOutputs(&this->grid);
    std::__cxx11::to_string(&local_238,iVar3);
    std::operator+(&local_1f0,&local_210,&local_238);
    std::operator+(&local_1d0,&local_1f0," outputs, but ");
    std::operator+(&local_1b0,&local_1d0,&this->valsfilename);
    std::operator+(&local_190,&local_1b0," specifies ");
    sVar7 = TasGrid::Data2D<double>::getStride((Data2D<double> *)local_38);
    std::__cxx11::to_string(&local_258,sVar7);
    std::operator+(&local_170,&local_190,&local_258);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iassert(this,sVar6 == (long)(iVar2 * 2),pcVar5);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator(&local_211);
  }
  else {
    sVar6 = TasGrid::Data2D<double>::getStride((Data2D<double> *)local_38);
    iVar2 = TasGrid::TasmanianSparseGrid::getNumOutputs(&this->grid);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_318,"grid is set for ",&local_319);
    iVar3 = TasGrid::TasmanianSparseGrid::getNumOutputs(&this->grid);
    std::__cxx11::to_string(&local_340,iVar3);
    std::operator+(&local_2f8,&local_318,&local_340);
    std::operator+(&local_2d8,&local_2f8," outputs, but ");
    std::operator+(&local_2b8,&local_2d8,&this->valsfilename);
    std::operator+(&local_298,&local_2b8," specifies ");
    sVar7 = TasGrid::Data2D<double>::getStride((Data2D<double> *)local_38);
    std::__cxx11::to_string(&local_360,sVar7);
    std::operator+(&local_278,&local_298,&local_360);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    iassert(this,sVar6 == (long)iVar2,pcVar5);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator(&local_319);
  }
  bVar1 = (this->pass_flag & 1U) != 0;
  if (bVar1) {
    TasGrid::Data2D<double>::release(&local_380,(Data2D<double> *)local_38);
    TasGrid::TasmanianSparseGrid::setHierarchicalCoefficients((vector *)this);
    std::vector<double,_std::allocator<double>_>::~vector(&local_380);
  }
  local_364 = (uint)!bVar1;
  TasGrid::Data2D<double>::~Data2D((Data2D<double> *)local_38);
  return;
}

Assistant:

void TasgridWrapper::setHierarchy(){
    auto vals = readMatrix(valsfilename);
    iassert(vals.getNumStrips() == grid.getNumPoints(),
            (std::string("grid is awaiting ") + std::to_string(grid.getNumPoints()) + " hierarchical surpluses, but "
             + valsfilename + " specifies " + std::to_string(vals.getNumStrips())).c_str());
    if (grid.isFourier())
        iassert((vals.getStride() == (size_t) (2 * grid.getNumOutputs())),
                (std::string("fourier grid is set for ") + std::to_string(grid.getNumOutputs()) + " outputs, but "
                 + valsfilename + " specifies " + std::to_string(vals.getStride())).c_str());
    else
        iassert((vals.getStride() == (size_t) grid.getNumOutputs()),
                (std::string("grid is set for ") + std::to_string(grid.getNumOutputs()) + " outputs, but "
                 + valsfilename + " specifies " + std::to_string(vals.getStride())).c_str());
    if (not pass_flag) return;
    grid.setHierarchicalCoefficients(vals.release());
}